

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-custom.cc
# Opt level: O3

bool __thiscall DataSourceCustom::load_animation_table(DataSourceCustom *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long lVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  undefined8 *puVar7;
  long *plVar8;
  size_type *psVar9;
  long lVar10;
  ulong uVar11;
  undefined8 uVar12;
  Animation *pAVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  vector<Data::Animation,_std::allocator<Data::Animation>_> animations;
  Animation animation;
  ConfigFile meta;
  stringstream stream_1;
  stringstream stream;
  string local_420;
  int local_3fc;
  string local_3f8;
  undefined1 local_3d8 [32];
  ios_base *local_3b8;
  ulong local_3b0;
  Animation local_3a4;
  DataSourceCustom *local_398;
  ios_base *local_390;
  ResInfo *local_388;
  long local_380;
  ConfigFile local_378;
  string local_340;
  undefined8 auStack_320 [12];
  ios_base local_2c0 [112];
  char acStack_250 [152];
  stringstream local_1b8 [16];
  long local_1a8 [2];
  undefined8 auStack_198 [12];
  ios_base aiStack_138 [112];
  char acStack_c8 [152];
  
  local_398 = this;
  local_388 = get_info(this,AssetAnimation);
  if (local_388 == (ResInfo *)0x0) {
LAB_0013608a:
    bVar4 = false;
  }
  else {
    uVar5 = Data::get_resource_count(AssetAnimation);
    bVar4 = true;
    if (uVar5 != 0) {
      paVar1 = &local_3f8.field_2;
      local_390 = local_2c0;
      local_398 = (DataSourceCustom *)&(local_398->super_DataSourceBase).animation_table;
      local_3b8 = aiStack_138;
      local_3b0 = 0;
      do {
        std::__cxx11::stringstream::stringstream(local_1b8);
        lVar10 = *(long *)(local_1a8[0] + -0x18);
        if (acStack_c8[lVar10 + 1] == '\0') {
          std::ios::widen((char)local_1a8 + (char)lVar10);
          acStack_c8[lVar10 + 1] = '\x01';
        }
        acStack_c8[lVar10] = '0';
        *(undefined8 *)((long)auStack_198 + *(long *)(local_1a8[0] + -0x18)) = 3;
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        ConfigFile::ConfigFile(&local_378);
        pcVar2 = (local_388->path)._M_dataplus._M_p;
        local_3f8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3f8,pcVar2,pcVar2 + (local_388->path)._M_string_length);
        std::__cxx11::string::append((char *)&local_3f8);
        std::__cxx11::stringbuf::str();
        uVar12 = (Animation *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != paVar1) {
          uVar12 = local_3f8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar12 < (Animation *)((uint8_t *)local_3d8._8_8_ + local_3f8._M_string_length))
        {
          pAVar13 = (Animation *)0xf;
          if ((pointer)local_3d8._0_8_ != (pointer)(local_3d8 + 0x10)) {
            pAVar13 = (Animation *)local_3d8._16_8_;
          }
          if (pAVar13 < (Animation *)((uint8_t *)local_3d8._8_8_ + local_3f8._M_string_length))
          goto LAB_00135b52;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)local_3d8,0,(char *)0x0,(ulong)local_3f8._M_dataplus._M_p);
        }
        else {
LAB_00135b52:
          puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3f8,local_3d8._0_8_)
          ;
        }
        local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
        psVar9 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_420.field_2._M_allocated_capacity = *psVar9;
          local_420.field_2._8_8_ = puVar7[3];
        }
        else {
          local_420.field_2._M_allocated_capacity = *psVar9;
          local_420._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_420._M_string_length = puVar7[1];
        *puVar7 = psVar9;
        puVar7[1] = 0;
        *(undefined1 *)psVar9 = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_420);
        local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
        psVar9 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_340.field_2._M_allocated_capacity = *psVar9;
          local_340.field_2._8_8_ = plVar8[3];
        }
        else {
          local_340.field_2._M_allocated_capacity = *psVar9;
          local_340._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_340._M_string_length = plVar8[1];
        *plVar8 = (long)psVar9;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        bVar4 = ConfigFile::load(&local_378,&local_340);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340._M_dataplus._M_p != &local_340.field_2) {
          operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_420._M_dataplus._M_p != &local_420.field_2) {
          operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_3d8._0_8_ != (pointer)(local_3d8 + 0x10)) {
          operator_delete((void *)local_3d8._0_8_,(ulong)(local_3d8._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != paVar1) {
          operator_delete(local_3f8._M_dataplus._M_p,
                          (ulong)(local_3f8.field_2._M_allocated_capacity + 1));
        }
        if (!bVar4) {
          ConfigFile::~ConfigFile(&local_378);
          std::__cxx11::stringstream::~stringstream(local_1b8);
          std::ios_base::~ios_base(local_3b8);
          goto LAB_0013608a;
        }
        local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"general","");
        local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_420,"count","");
        local_3f8._M_dataplus._M_p = local_3f8._M_dataplus._M_p & 0xffffffff00000000;
        iVar6 = ConfigFile::value<int>(&local_378,&local_340,&local_420,(int *)&local_3f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_420._M_dataplus._M_p != &local_420.field_2) {
          operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340._M_dataplus._M_p != &local_340.field_2) {
          operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
        }
        local_3d8._0_8_ = (pointer)0x0;
        local_3d8._8_8_ = (Animation *)0x0;
        local_3d8._16_8_ = (Animation *)0x0;
        if (iVar6 != 0) {
          local_380 = (long)iVar6;
          lVar10 = 0;
          do {
            std::__cxx11::stringstream::stringstream((stringstream *)&local_340);
            lVar3 = *(long *)(local_340.field_2._M_allocated_capacity - 0x18);
            if (acStack_250[lVar3 + 1] == '\0') {
              std::ios::widen((char)&local_340 + '\x10' + (char)lVar3);
              acStack_250[lVar3 + 1] = '\x01';
            }
            acStack_250[lVar3] = '0';
            *(undefined8 *)
             ((long)auStack_320 + *(long *)(local_340.field_2._M_allocated_capacity - 0x18)) = 3;
            std::ostream::_M_insert<unsigned_long>((ulong)&local_340.field_2);
            std::__cxx11::stringbuf::str();
            local_3f8._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"sprite","");
            local_3fc = 0;
            iVar6 = ConfigFile::value<int>(&local_378,&local_420,&local_3f8,&local_3fc);
            local_3a4.sprite = (uint8_t)iVar6;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3f8._M_dataplus._M_p != paVar1) {
              operator_delete(local_3f8._M_dataplus._M_p,
                              (ulong)(local_3f8.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_dataplus._M_p != &local_420.field_2) {
              operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::stringbuf::str();
            local_3f8._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"x","");
            local_3fc = 0;
            local_3a4.x = ConfigFile::value<int>(&local_378,&local_420,&local_3f8,&local_3fc);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3f8._M_dataplus._M_p != paVar1) {
              operator_delete(local_3f8._M_dataplus._M_p,
                              (ulong)(local_3f8.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_dataplus._M_p != &local_420.field_2) {
              operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::stringbuf::str();
            local_3f8._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"y","");
            local_3fc = 0;
            local_3a4.y = ConfigFile::value<int>(&local_378,&local_420,&local_3f8,&local_3fc);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3f8._M_dataplus._M_p != paVar1) {
              operator_delete(local_3f8._M_dataplus._M_p,
                              (ulong)(local_3f8.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_dataplus._M_p != &local_420.field_2) {
              operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_3d8._8_8_ == local_3d8._16_8_) {
              std::vector<Data::Animation,std::allocator<Data::Animation>>::
              _M_realloc_insert<Data::Animation_const&>
                        ((vector<Data::Animation,std::allocator<Data::Animation>> *)local_3d8,
                         (iterator)local_3d8._8_8_,&local_3a4);
            }
            else {
              *(int *)(local_3d8._8_8_ + 8) = local_3a4.y;
              *(ulong *)local_3d8._8_8_ = CONCAT44(local_3a4.x,local_3a4._0_4_);
              local_3d8._8_8_ = local_3d8._8_8_ + 0xc;
            }
            std::__cxx11::stringstream::~stringstream((stringstream *)&local_340);
            std::ios_base::~ios_base(local_390);
            lVar10 = lVar10 + 1;
          } while (local_380 != lVar10);
        }
        std::
        vector<std::vector<Data::Animation,_std::allocator<Data::Animation>_>,_std::allocator<std::vector<Data::Animation,_std::allocator<Data::Animation>_>_>_>
        ::push_back((vector<std::vector<Data::Animation,_std::allocator<Data::Animation>_>,_std::allocator<std::vector<Data::Animation,_std::allocator<Data::Animation>_>_>_>
                     *)local_398,(value_type *)local_3d8);
        if ((pointer)local_3d8._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ - local_3d8._0_8_);
        }
        ConfigFile::~ConfigFile(&local_378);
        std::__cxx11::stringstream::~stringstream(local_1b8);
        std::ios_base::~ios_base(local_3b8);
        uVar11 = local_3b0 + 1;
        uVar5 = Data::get_resource_count(AssetAnimation);
        local_3b0 = uVar11;
      } while (uVar11 < uVar5);
      bVar4 = true;
    }
  }
  return bVar4;
}

Assistant:

bool
DataSourceCustom::load_animation_table() {
  ResInfo *info = get_info(Data::AssetAnimation);
  if (info == nullptr) {
    return false;
  }

  for (size_t i = 0; i < Data::get_resource_count(Data::AssetAnimation); i++) {
    std::stringstream stream;
    stream << std::setfill('0') << std::setw(3) << i;
    ConfigFile meta = ConfigFile();
    if (!meta.load(info->path + "/" + stream.str() + ".ini")) {
      return false;
    }
    size_t count = meta.value("general", "count", 0);
    std::vector<Data::Animation> animations;
    for (size_t j = 0; j < count; j++) {
      std::stringstream stream;
      stream << std::setfill('0') << std::setw(3) << j;
      Data::Animation animation;
      animation.sprite = meta.value(stream.str(), "sprite", 0);
      animation.x = meta.value(stream.str(), "x", 0);
      animation.y = meta.value(stream.str(), "y", 0);
      animations.push_back(animation);
    }
    animation_table.push_back(animations);
  }

  return true;
}